

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImStrTrimBlanks(char *buf)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char *__src;
  char *pcVar4;
  char *pcVar5;
  
  lVar3 = 0;
  pcVar2 = buf;
  for (__src = buf; (*__src == '\t' || (*__src == ' ')); __src = __src + 1) {
    pcVar2 = pcVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  pcVar4 = __src + -1;
  do {
    pcVar1 = pcVar4 + 1;
    pcVar4 = pcVar4 + 1;
    pcVar5 = pcVar4;
  } while (*pcVar1 != '\0');
  for (; (__src < pcVar4 && ((pcVar4[-1] == ' ' || (pcVar5 = pcVar4, pcVar4[-1] == '\t'))));
      pcVar4 = pcVar4 + -1) {
    pcVar5 = __src;
  }
  if (lVar3 != 0) {
    memmove(buf,__src,(long)pcVar5 - (long)pcVar2);
  }
  pcVar5[lVar3] = '\0';
  return;
}

Assistant:

void ImStrTrimBlanks(char* buf)
{
    char* p = buf;
    while (p[0] == ' ' || p[0] == '\t')     // Leading blanks
        p++;
    char* p_start = p;
    while (*p != 0)                         // Find end of string
        p++;
    while (p > p_start && (p[-1] == ' ' || p[-1] == '\t'))  // Trailing blanks
        p--;
    if (p_start != buf)                     // Copy memory if we had leading blanks
        memmove(buf, p_start, p - p_start);
    buf[p - p_start] = 0;                   // Zero terminate
}